

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

void * encode_attr_for_xmit(attr_list l,AttrBuffer b,int *length)

{
  uint size;
  AttrBuffer in_RDX;
  long *in_RSI;
  short *in_RDI;
  attr_list in_stack_00000020;
  uint in_stack_ffffffffffffffdc;
  void *local_8;
  
  if ((*in_RDI == 0) && (*(char *)(*(long *)(in_RDI + 8) + 2) == '\0')) {
    *(uint *)&in_RDX->tmp_buffer = (*(byte *)(*(long *)(in_RDI + 8) + 1) - 1) * 8 + 0xc;
    local_8 = *(void **)(in_RDI + 8);
  }
  else {
    add_to_tmp_buffer(in_RDX,in_stack_ffffffffffffffdc);
    size = words_bigendian;
    if (words_bigendian == -1) {
      size = set_bigendian();
    }
    *(char *)*in_RSI = (char)size;
    *(undefined1 *)(*in_RSI + 1) = 0;
    *(undefined1 *)(*in_RSI + 2) = 0;
    *(undefined1 *)(*in_RSI + 3) = 0;
    *(undefined4 *)((long)in_RSI + 0xc) = 4;
    recursive_encode(in_stack_00000020,(AttrBuffer)l,b._4_4_);
    recursive_encode(in_stack_00000020,(AttrBuffer)l,b._4_4_);
    *(undefined4 *)&in_RDX->tmp_buffer = *(undefined4 *)((long)in_RSI + 0xc);
    add_to_tmp_buffer(in_RDX,size);
    local_8 = (void *)*in_RSI;
  }
  return local_8;
}

Assistant:

extern void *
encode_attr_for_xmit(attr_list l, AttrBuffer b, int *length)
{
    if (l->list_of_lists == 0) {
	if (l->l.list.iattrs->other_attr_count == 0) {
	    /* fast case, a single list with no non-integer attributes */
	    /* just return a pointer to the data block */
	    *length = sizeof(struct int_attr_struct) + 
		(l->l.list.iattrs->int_attr_count - 1) * sizeof(int_attr);
	    return l->l.list.iattrs;
	}
    }
    add_to_tmp_buffer(b, (unsigned)sizeof(struct int_attr_struct));
    ((int_attr_p) b->tmp_buffer)->byte_order = WORDS_BIGENDIAN;
    ((int_attr_p) b->tmp_buffer)->int_attr_count = 0;
    ((int_attr_p) b->tmp_buffer)->other_attr_count = 0;
    ((int_attr_p) b->tmp_buffer)->junk = 0;
    /* not the simple case */
    b->tmp_buffer_in_use_size = 4;
    /* first the int Attributes */
    recursive_encode(l, b, Attr_Int4);
    /* then the remaining Attributes */
    recursive_encode(l, b, Attr_Undefined);
    *length = b->tmp_buffer_in_use_size;
    add_to_tmp_buffer(b, 8);  /* pad at the end */
    return b->tmp_buffer;
}